

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
          (Matrix<double,_4,_1,_0,_4,_1> *this,Scalar *x,Scalar *y,Scalar *z,Scalar *w)

{
  double dVar1;
  double *pdVar2;
  Scalar *w_local;
  Scalar *z_local;
  Scalar *y_local;
  Scalar *x_local;
  Matrix<double,_4,_1,_0,_4,_1> *this_local;
  
  PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::PlainObjectBase
            (&this->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>);
  PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::_check_template_params();
  dVar1 = *x;
  pdVar2 = DenseStorage<double,_4,_4,_1,_0>::data((DenseStorage<double,_4,_4,_1,_0> *)this);
  *pdVar2 = dVar1;
  dVar1 = *y;
  pdVar2 = DenseStorage<double,_4,_4,_1,_0>::data((DenseStorage<double,_4,_4,_1,_0> *)this);
  pdVar2[1] = dVar1;
  dVar1 = *z;
  pdVar2 = DenseStorage<double,_4,_4,_1,_0>::data((DenseStorage<double,_4,_4,_1,_0> *)this);
  pdVar2[2] = dVar1;
  dVar1 = *w;
  pdVar2 = DenseStorage<double,_4,_4,_1,_0>::data((DenseStorage<double,_4,_4,_1,_0> *)this);
  pdVar2[3] = dVar1;
  return;
}

Assistant:

Matrix(const Scalar& x, const Scalar& y, const Scalar& z, const Scalar& w)
    {
      Base::_check_template_params();
      EIGEN_STATIC_ASSERT_VECTOR_SPECIFIC_SIZE(Matrix, 4)
      m_storage.data()[0] = x;
      m_storage.data()[1] = y;
      m_storage.data()[2] = z;
      m_storage.data()[3] = w;
    }